

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  FieldDescriptor *field_00;
  FieldGenerator *pFVar6;
  FileDescriptor *file;
  FieldDescriptor *field_01;
  string local_a8;
  FieldDescriptor *local_88;
  FieldDescriptor *field;
  int i_1;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,"void $classname$::SharedDtor() {\n","classname",&this->classname_);
  io::Printer::Indent(pPStack_18);
  local_1c = 0;
  while( true ) {
    iVar1 = local_1c;
    iVar4 = Descriptor::field_count(this->descriptor_);
    if (iVar4 <= iVar1) break;
    field_00 = Descriptor::field(this->descriptor_,local_1c);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field_00);
    (*pFVar6->_vptr_FieldGenerator[10])(pFVar6,pPStack_18);
    local_1c = local_1c + 1;
  }
  file = Descriptor::file(this->descriptor_);
  pPVar2 = pPStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_1,"",(allocator<char> *)((long)&field + 7));
  PrintHandlingOptionalStaticInitializers
            (file,pPVar2,"if (this != default_instance_) {\n","if (this != &default_instance()) {\n"
             ,(char *)0x0,&local_40,(char *)0x0,(string *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  field._0_4_ = 0;
  while( true ) {
    iVar1 = (int)field;
    iVar4 = Descriptor::field_count(this->descriptor_);
    if (iVar4 <= iVar1) break;
    local_88 = Descriptor::field(this->descriptor_,(int)field);
    bVar3 = FieldDescriptor::is_repeated(local_88);
    if (!bVar3) {
      CVar5 = FieldDescriptor::cpp_type(local_88);
      pPVar2 = pPStack_18;
      if (CVar5 == CPPTYPE_MESSAGE) {
        FieldName_abi_cxx11_(&local_a8,(cxx *)local_88,field_01);
        io::Printer::Print(pPVar2,"  delete $name$_;\n","name",&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    field._0_4_ = (int)field + 1;
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"  }\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedDestructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedDtor() {\n",
    "classname", classname_);
  printer->Indent();
  // Write the destructors for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateDestructorCode(printer);
  }

  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "if (this != default_instance_) {\n",
    // Without.
    "if (this != &default_instance()) {\n");

  // We need to delete all embedded messages.
  // TODO(kenton):  If we make unset messages point at default instances
  //   instead of NULL, then it would make sense to move this code into
  //   MessageFieldGenerator::GenerateDestructorCode().
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print("  delete $name$_;\n",
                     "name", FieldName(field));
    }
  }

  printer->Outdent();
  printer->Print(
    "  }\n"
    "}\n"
    "\n");
}